

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AnalyzedAssertion.cpp
# Opt level: O0

VisitResult * __thiscall
slang::analysis::ClockVisitor::visit
          (ClockVisitor *this,SequenceConcatExpr *expr,Clock outerClock,
          bitmask<slang::analysis::VisitFlags> flags)

{
  SourceRange opRange;
  bool bVar1;
  __optional_ne_t<unsigned_int,_unsigned_int> _Var2;
  bitmask<slang::analysis::VisitFlags> bVar3;
  reference pEVar4;
  reference ppTVar5;
  long in_RDX;
  ClockVisitor *in_RSI;
  VisitResult *in_RDI;
  VisitResult result;
  Element *elem;
  iterator __end2;
  iterator __begin2;
  span<const_slang::ast::SequenceConcatExpr::Element,_18446744073709551615UL> *__range2;
  bool isMulticlockedSeq;
  bool lastWasMulticlocked;
  AssertionExpr *lastExpr;
  Clock endClock;
  Clock firstClock;
  span<const_slang::ast::SequenceConcatExpr::Element,_18446744073709551615UL>
  *in_stack_fffffffffffffec8;
  VisitResult *in_stack_fffffffffffffed0;
  span<const_slang::ast::SequenceConcatExpr::Element,_18446744073709551615UL>
  *in_stack_fffffffffffffed8;
  Clock in_stack_fffffffffffffee8;
  undefined1 in_stack_fffffffffffffef7;
  TimingControl *in_stack_fffffffffffffef8;
  VisitResult *in_stack_ffffffffffffff00;
  TimingControl *in_stack_ffffffffffffff08;
  TimingControl *local_f0;
  VisitResult *expr_00;
  SourceLocation in_stack_ffffffffffffff38;
  AssertionExpr *in_stack_ffffffffffffff48;
  ClockVisitor *in_stack_ffffffffffffff50;
  bitmask<slang::analysis::VisitFlags> in_stack_ffffffffffffff58;
  SourceLocation in_stack_ffffffffffffff60;
  TimingControl *local_78;
  byte local_70;
  __normal_iterator<const_slang::ast::SequenceConcatExpr::Element_*,_std::span<const_slang::ast::SequenceConcatExpr::Element,_18446744073709551615UL>_>
  local_58;
  long local_50;
  undefined1 local_42;
  byte local_41;
  VisitResult *local_40;
  TimingControl *local_38;
  TimingControl *local_30;
  
  local_30 = (TimingControl *)0x0;
  local_38 = (TimingControl *)0x0;
  local_40 = (VisitResult *)0x0;
  local_41 = 0;
  local_42 = 0;
  local_50 = in_RDX + 0x10;
  expr_00 = in_RDI;
  local_58._M_current =
       (Element *)
       std::span<const_slang::ast::SequenceConcatExpr::Element,_18446744073709551615UL>::begin
                 (in_stack_fffffffffffffec8);
  std::span<const_slang::ast::SequenceConcatExpr::Element,_18446744073709551615UL>::end
            (in_stack_fffffffffffffed8);
  do {
    bVar1 = __gnu_cxx::
            operator==<const_slang::ast::SequenceConcatExpr::Element_*,_std::span<const_slang::ast::SequenceConcatExpr::Element,_18446744073709551615UL>_>
                      ((__normal_iterator<const_slang::ast::SequenceConcatExpr::Element_*,_std::span<const_slang::ast::SequenceConcatExpr::Element,_18446744073709551615UL>_>
                        *)in_stack_fffffffffffffed0,
                       (__normal_iterator<const_slang::ast::SequenceConcatExpr::Element_*,_std::span<const_slang::ast::SequenceConcatExpr::Element,_18446744073709551615UL>_>
                        *)in_stack_fffffffffffffec8);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      if (local_30 == (TimingControl *)0x0) {
        memset(in_RDI,0,0x38);
        VisitResult::VisitResult(in_stack_fffffffffffffed0);
      }
      else {
        VisitResult::VisitResult
                  (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
                   (bool)in_stack_fffffffffffffef7,in_stack_fffffffffffffee8);
      }
      return expr_00;
    }
    pEVar4 = __gnu_cxx::
             __normal_iterator<const_slang::ast::SequenceConcatExpr::Element_*,_std::span<const_slang::ast::SequenceConcatExpr::Element,_18446744073709551615UL>_>
             ::operator*(&local_58);
    not_null<const_slang::ast::AssertionExpr_*>::operator->
              ((not_null<const_slang::ast::AssertionExpr_*> *)0x826971);
    bitmask<slang::analysis::VisitFlags>::bitmask
              ((bitmask<slang::analysis::VisitFlags> *)&stack0xffffffffffffff58,RequireSequence);
    bVar3 = bitmask<slang::analysis::VisitFlags>::operator|
                      ((bitmask<slang::analysis::VisitFlags> *)in_stack_fffffffffffffed8,
                       (bitmask<slang::analysis::VisitFlags> *)in_stack_fffffffffffffed0);
    ast::AssertionExpr::
    visit<slang::analysis::ClockVisitor,slang::ast::TimingControl_const*&,slang::bitmask<slang::analysis::VisitFlags>>
              ((AssertionExpr *)in_stack_ffffffffffffff38,in_RSI,(TimingControl **)expr_00,
               (bitmask<slang::analysis::VisitFlags> *)in_RDI);
    bVar1 = SmallVectorBase<const_slang::ast::TimingControl_*>::empty
                      ((SmallVectorBase<const_slang::ast::TimingControl_*> *)
                       &stack0xffffffffffffff60);
    if (!bVar1) {
      if (local_78 == (TimingControl *)0x0) {
        ppTVar5 = SmallVectorBase<const_slang::ast::TimingControl_*>::back
                            ((SmallVectorBase<const_slang::ast::TimingControl_*> *)
                             &stack0xffffffffffffff60);
        local_f0 = *ppTVar5;
      }
      else {
        local_f0 = local_78;
      }
      local_38 = local_f0;
      if (local_30 == (TimingControl *)0x0) {
        in_stack_ffffffffffffff08 =
             (TimingControl *)
             SmallVectorBase<const_slang::ast::TimingControl_*>::operator[]
                       ((SmallVectorBase<const_slang::ast::TimingControl_*> *)
                        &stack0xffffffffffffff60,0);
        local_30 = *(TimingControl **)in_stack_ffffffffffffff08;
      }
      else {
        if ((local_70 & 1) == 0) {
          in_stack_fffffffffffffef8 = local_30;
          in_stack_ffffffffffffff00 =
               (VisitResult *)
               SmallVectorBase<const_slang::ast::TimingControl_*>::operator[]
                         ((SmallVectorBase<const_slang::ast::TimingControl_*> *)
                          &stack0xffffffffffffff60,0);
          in_stack_fffffffffffffef7 =
               isSameClock(in_stack_ffffffffffffff08,(TimingControl *)in_stack_ffffffffffffff00);
          if ((bool)in_stack_fffffffffffffef7) goto LAB_00826bb1;
        }
        if ((local_41 & 1) == 0) {
          requireOnlyNonEmptyMatch(in_RSI,(AssertionExpr *)expr_00);
        }
        if ((local_70 & 1) == 0) {
          in_stack_fffffffffffffee8 =
               (Clock)not_null<const_slang::ast::AssertionExpr_*>::operator*
                                ((not_null<const_slang::ast::AssertionExpr_*> *)0x826b0a);
          requireOnlyNonEmptyMatch(in_RSI,(AssertionExpr *)expr_00);
        }
        local_42 = 1;
        if ((1 < (pEVar4->delay).min) ||
           (_Var2 = std::operator!=((optional<unsigned_int> *)in_stack_fffffffffffffed0,
                                    (uint *)in_stack_fffffffffffffec8), _Var2)) {
          in_stack_fffffffffffffed8 =
               (span<const_slang::ast::SequenceConcatExpr::Element,_18446744073709551615UL> *)
               not_null<const_slang::ast::AssertionExpr_*>::operator*
                         ((not_null<const_slang::ast::AssertionExpr_*> *)0x826b6e);
          in_stack_ffffffffffffff38 = (pEVar4->delayRange).startLoc;
          opRange.startLoc._4_4_ = bVar3.m_bits;
          opRange.startLoc._0_4_ = in_stack_ffffffffffffff58.m_bits;
          opRange.endLoc = in_stack_ffffffffffffff60;
          badMulticlockedSeq(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                             (AssertionExpr *)(pEVar4->delayRange).endLoc,opRange);
        }
      }
    }
LAB_00826bb1:
    in_stack_fffffffffffffed0 =
         (VisitResult *)
         not_null::operator_cast_to_AssertionExpr_
                   ((not_null<const_slang::ast::AssertionExpr_*> *)0x826bc2);
    local_41 = local_70 & 1;
    local_40 = in_stack_fffffffffffffed0;
    VisitResult::~VisitResult((VisitResult *)0x826bf3);
    __gnu_cxx::
    __normal_iterator<const_slang::ast::SequenceConcatExpr::Element_*,_std::span<const_slang::ast::SequenceConcatExpr::Element,_18446744073709551615UL>_>
    ::operator++(&local_58);
  } while( true );
}

Assistant:

VisitResult visit(const SequenceConcatExpr& expr, Clock outerClock, bitmask<VF> flags) {
        Clock firstClock = nullptr;
        Clock endClock = nullptr;
        const AssertionExpr* lastExpr = nullptr;
        bool lastWasMulticlocked = false;
        bool isMulticlockedSeq = false;

        for (auto& elem : expr.elements) {
            auto result = elem.sequence->visit(*this, outerClock, flags | VF::RequireSequence);
            if (!result.clocks.empty()) {
                endClock = result.endClock == nullptr ? result.clocks.back() : result.endClock;
                if (!firstClock) {
                    firstClock = result.clocks[0];
                }
                else if (result.isMulticlockedSeq || !isSameClock(*firstClock, *result.clocks[0])) {
                    // When concatenating differently clocked sequences, the maximal single-clocked
                    // subsequences must not admit an empty match.
                    if (!lastWasMulticlocked)
                        requireOnlyNonEmptyMatch(*lastExpr);
                    if (!result.isMulticlockedSeq)
                        requireOnlyNonEmptyMatch(*elem.sequence);

                    isMulticlockedSeq = true;
                    if (elem.delay.min > 1 || elem.delay.max != elem.delay.min)
                        badMulticlockedSeq(*elem.sequence, *lastExpr, elem.delayRange);
                }
            }
            lastExpr = elem.sequence;
            lastWasMulticlocked = result.isMulticlockedSeq;
        }

        if (!firstClock)
            return {};

        return {firstClock, isMulticlockedSeq, endClock};
    }